

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PoolList.hpp
# Opt level: O2

Resolver * __thiscall
PoolList<Server::Private::Resolver>::
append<String_const&,unsigned_short,Server::Private::EstablisherImpl&>
          (PoolList<Server::Private::Resolver> *this,String *a,unsigned_short b,EstablisherImpl *c)

{
  Resolver *pRVar1;
  
  pRVar1 = allocateFreeItem(this);
  Server::Private::Resolver::Resolver(pRVar1,a,b,c);
  pRVar1 = linkFreeItem(this,pRVar1);
  return pRVar1;
}

Assistant:

T& append(A a, B b, C c) {return linkFreeItem(new (allocateFreeItem()) T(a, b, c));}